

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void duckdb::MaybeRepartition
               (ClientContext *context,RadixHTGlobalSinkState *gstate,RadixHTLocalSinkState *lstate)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pLVar2;
  pointer pLVar3;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var4;
  __int_type _Var5;
  int iVar6;
  type pGVar7;
  type this_00;
  ArenaAllocator *this_01;
  idx_t iVar8;
  type pPVar9;
  idx_t iVar10;
  ulong uVar11;
  type pTVar12;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> this_02;
  pointer this_03;
  ulong uVar13;
  BufferManager *pBVar14;
  undefined4 extraout_var;
  TupleDataLayout *pTVar15;
  idx_t extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ClientContext *pCVar16;
  RadixHTLocalSinkState *this_04;
  __int_type _Var17;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_05;
  undefined1 auVar18 [16];
  double dVar19;
  unique_lock<std::mutex> guard;
  element_type *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  RadixHTLocalSinkState *local_60;
  ClientContext *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  pointer local_48;
  element_type *local_40;
  pointer local_38;
  
  local_58 = context;
  pGVar7 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator*(&lstate->ht);
  this_00 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator*(&gstate->temporary_memory_state);
  local_70 = (element_type *)
             (pGVar7->aggregate_allocator).internal.
             super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _local_68 = (pGVar7->aggregate_allocator).internal.
              super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (_local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      _local_68->_M_use_count = _local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _local_68->_M_use_count = _local_68->_M_use_count + 1;
    }
  }
  this_01 = shared_ptr<duckdb::ArenaAllocator,_true>::operator->
                      ((shared_ptr<duckdb::ArenaAllocator,_true> *)&stack0xffffffffffffff90);
  iVar8 = ArenaAllocator::AllocationSize(this_01);
  local_60 = lstate;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pGVar7;
  if (_local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_local_68);
  }
  this_05 = &pGVar7->partitioned_data;
  pPVar9 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator*(this_05);
  iVar10 = PartitionedTupleData::SizeInBytes(pPVar9);
  uVar13 = iVar10 + iVar8 + (long)local_50._M_pi[0xb]._vptr__Sp_counted_base * 8;
  iVar10 = TemporaryMemoryState::GetReservation(this_00);
  uVar11 = iVar10 / gstate->number_of_threads;
  if ((uVar11 < uVar13) && (((gstate->external)._M_base._M_i & 1U) == 0)) {
    local_70 = (element_type *)&(gstate->super_GlobalSinkState).super_StateWithBlockableTasks.lock;
    _local_68 = _local_68 & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffff90);
    local_68 = 1;
    iVar10 = TemporaryMemoryState::GetReservation(this_00);
    uVar11 = iVar10 / gstate->number_of_threads;
    if (uVar11 < uVar13) {
      TemporaryMemoryState::SetMinimumReservation
                (this_00,(gstate->minimum_reservation).super___atomic_base<unsigned_long>._M_i +
                         gstate->number_of_threads * iVar8);
      iVar8 = gstate->number_of_threads;
      iVar10 = TemporaryMemoryState::GetRemainingSize(this_00);
      uVar11 = iVar8 * uVar13;
      if (uVar11 < iVar10 || uVar11 - iVar10 == 0) {
        uVar11 = iVar10;
      }
      TemporaryMemoryState::SetRemainingSizeAndUpdateReservation(this_00,local_58,uVar11 * 2);
      iVar8 = TemporaryMemoryState::GetReservation(this_00);
      uVar11 = iVar8 / gstate->number_of_threads;
    }
    ::std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)&stack0xffffffffffffff90);
  }
  this_04 = (RadixHTLocalSinkState *)&gstate->config;
  if (uVar11 < uVar13) {
    RadixHTConfig::SetRadixBitsInternal((RadixHTConfig *)this_04,8,true);
    if (((((RadixHTConfig *)this_04)->sink->external)._M_base._M_i & 1U) != 0) {
      this = &local_60->abandoned_data;
      if ((local_60->abandoned_data).
          super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
          .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl ==
          (PartitionedTupleData *)0x0) {
        local_38 = (pointer)BufferManager::GetBufferManager(local_58);
        local_40 = (gstate->radix_ht->layout_ptr).internal.
                   super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var1 = (gstate->radix_ht->layout_ptr).internal.
                 super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        local_48 = (pointer)(gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i
        ;
        local_60 = this_04;
        pTVar12 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                            (&gstate->radix_ht->layout_ptr);
        pLVar2 = (pTVar12->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar3 = (pTVar12->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        this_02._M_head_impl = (PartitionedTupleData *)operator_new(0x90);
        local_70 = local_40;
        _local_68 = p_Var1;
        RadixPartitionedTupleData::RadixPartitionedTupleData
                  ((RadixPartitionedTupleData *)this_02._M_head_impl,(BufferManager *)local_38,
                   (shared_ptr<duckdb::TupleDataLayout,_true> *)&stack0xffffffffffffff90,
                   (idx_t)local_48,((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555 - 1);
        this_04 = local_60;
        if (_local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_local_68);
        }
        _Var4._M_head_impl =
             (this->
             super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
             .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
        (this->
        super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
             this_02._M_head_impl;
        if (_Var4._M_head_impl != (PartitionedTupleData *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_PartitionedTupleData + 8))();
        }
      }
      _Var17 = (gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i;
      local_50._M_pi[7]._M_use_count = (int)_Var17;
      local_50._M_pi[7]._M_weak_count = (int)(_Var17 >> 0x20);
      GroupedAggregateHashTable::AcquirePartitionedData
                ((GroupedAggregateHashTable *)&stack0xffffffffffffff90);
      this_03 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                              *)&stack0xffffffffffffff90);
      pPVar9 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator*(this);
      pCVar16 = local_58;
      PartitionedTupleData::Repartition(this_03,local_58,pPVar9);
      if (local_70 != (element_type *)0x0) {
        (*((Allocator *)
          (local_70->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start)->free_function)
                  ((PrivateAllocatorData *)local_70,(data_ptr_t)pCVar16,extraout_RDX);
      }
    }
  }
  if (2 < gstate->number_of_threads) {
    local_60 = this_04;
    pPVar9 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator*(this_05);
    iVar8 = PartitionedTupleData::PartitionCount(pPVar9);
    if (iVar8 == 0) {
      _Var17 = 0xffffffffffffffff;
    }
    else {
      uVar13 = iVar8 >> 1 | iVar8;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar13 = uVar13 >> 0x10 | uVar13;
      _Var17 = *(__int_type *)
                (&DAT_01e3a320 + ((uVar13 >> 0x20 | uVar13) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
    }
    pBVar14 = BufferManager::GetBufferManager(local_58);
    iVar6 = (*pBVar14->_vptr_BufferManager[0xf])(pBVar14);
    auVar18._4_4_ = extraout_var;
    auVar18._0_4_ = iVar6;
    iVar10 = GroupedAggregateHashTable::GetMaterializedCount
                       ((GroupedAggregateHashTable *)local_50._M_pi);
    pPVar9 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator*(this_05);
    pTVar15 = PartitionedTupleData::GetLayout(pPVar9);
    auVar18._8_4_ = extraout_var;
    auVar18._12_4_ = 0x45300000;
    dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 1.8;
    uVar13 = (ulong)dVar19;
    if (((long)(dVar19 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) <
        (iVar10 * pTVar15->row_width) / iVar8) {
      uVar13 = (gstate->config).maximum_sink_radix_bits;
      if (_Var17 + 2 < uVar13) {
        uVar13 = _Var17 + 2;
      }
      RadixHTConfig::SetRadixBitsInternal((RadixHTConfig *)local_60,uVar13,false);
    }
    _Var5 = (gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i;
    if (_Var17 != _Var5) {
      local_50._M_pi[7]._M_use_count = (int)_Var5;
      local_50._M_pi[7]._M_weak_count = (int)(_Var5 >> 0x20);
      GroupedAggregateHashTable::Repartition((GroupedAggregateHashTable *)local_50._M_pi);
    }
  }
  return;
}

Assistant:

void MaybeRepartition(ClientContext &context, RadixHTGlobalSinkState &gstate, RadixHTLocalSinkState &lstate) {
	auto &config = gstate.config;
	auto &ht = *lstate.ht;

	// Check if we're approaching the memory limit
	auto &temporary_memory_state = *gstate.temporary_memory_state;
	const auto aggregate_allocator_size = ht.GetAggregateAllocator()->AllocationSize();
	const auto total_size =
	    aggregate_allocator_size + ht.GetPartitionedData().SizeInBytes() + ht.Capacity() * sizeof(ht_entry_t);
	idx_t thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
	if (total_size > thread_limit) {
		// We're over the thread memory limit
		if (!gstate.external) {
			// We haven't yet triggered out-of-core behavior, but maybe we don't have to, grab the lock and check again
			auto guard = gstate.Lock();
			thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
			if (total_size > thread_limit) {
				// Out-of-core would be triggered below, update minimum reservation and try to increase the reservation
				temporary_memory_state.SetMinimumReservation(aggregate_allocator_size * gstate.number_of_threads +
				                                             gstate.minimum_reservation);
				auto remaining_size =
				    MaxValue<idx_t>(gstate.number_of_threads * total_size, temporary_memory_state.GetRemainingSize());
				temporary_memory_state.SetRemainingSizeAndUpdateReservation(context, 2 * remaining_size);
				thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
			}
		}
	}

	if (total_size > thread_limit) {
		if (gstate.config.SetRadixBitsToExternal()) {
			// We're approaching the memory limit, unpin the data
			if (!lstate.abandoned_data) {
				lstate.abandoned_data = make_uniq<RadixPartitionedTupleData>(
				    BufferManager::GetBufferManager(context), gstate.radix_ht.GetLayoutPtr(), config.GetRadixBits(),
				    gstate.radix_ht.GetLayout().ColumnCount() - 1);
			}
			ht.SetRadixBits(gstate.config.GetRadixBits());
			ht.AcquirePartitionedData()->Repartition(context, *lstate.abandoned_data);
		}
	}

	// We can go external when there are few threads, but we shouldn't repartition here
	if (gstate.number_of_threads <= RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD) {
		return;
	}

	const auto partition_count = ht.GetPartitionedData().PartitionCount();
	const auto current_radix_bits = RadixPartitioning::RadixBitsOfPowerOfTwo(partition_count);
	D_ASSERT(current_radix_bits <= config.GetRadixBits());

	const auto block_size = BufferManager::GetBufferManager(context).GetBlockSize();
	const auto row_size_per_partition =
	    ht.GetMaterializedCount() * ht.GetPartitionedData().GetLayout().GetRowWidth() / partition_count;
	if (row_size_per_partition > LossyNumericCast<idx_t>(config.BLOCK_FILL_FACTOR * static_cast<double>(block_size))) {
		// We crossed our block filling threshold, try to increment radix bits
		config.SetRadixBits(current_radix_bits + config.REPARTITION_RADIX_BITS);
	}

	const auto global_radix_bits = config.GetRadixBits();
	if (current_radix_bits == global_radix_bits) {
		return; // We're already on the right number of radix bits
	}

	// We're out-of-sync with the global radix bits, repartition
	ht.SetRadixBits(global_radix_bits);
	ht.Repartition();
}